

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtperrors.cpp
# Opt level: O2

string * __thiscall
jrtplib::RTPGetErrorString_abi_cxx11_(string *__return_storage_ptr__,jrtplib *this,int errcode)

{
  int *piVar1;
  int *piVar2;
  char *__s;
  allocator<char> local_6a;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char str [16];
  
  if ((int)this < 0) {
    piVar1 = &ErrorDescriptions;
    do {
      piVar2 = piVar1;
      if (*piVar2 == 0) {
        snprintf(str,0x10,"(%d)");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"Unknown error code",&local_69);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,str,&local_6a);
        std::operator+(__return_storage_ptr__,&local_68,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        return __return_storage_ptr__;
      }
      piVar1 = piVar2 + 4;
    } while (*piVar2 != (int)this);
    __s = *(char **)(piVar2 + 2);
  }
  else {
    __s = "No error";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string RTPGetErrorString(int errcode)
{
	int i;
	
	if (errcode >= 0)
		return std::string("No error");
	
	i = 0;
	while (ErrorDescriptions[i].code != 0)
	{
		if (ErrorDescriptions[i].code == errcode)
			return std::string(ErrorDescriptions[i].description);
		i++;
	}

	char str[16];
	
	RTP_SNPRINTF(str,16,"(%d)",errcode);
	
	return std::string("Unknown error code") + std::string(str);
}